

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddPort.c
# Opt level: O2

DdNode * zddPortFromBddStep(DdManager *dd,DdNode *B,int expected)

{
  int *piVar1;
  uint id;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *data;
  uint *puVar5;
  long lVar6;
  
  pDVar3 = dd->one;
  if ((DdNode *)((ulong)pDVar3 ^ 1) == B) {
    return dd->zero;
  }
  if (pDVar3 == B) {
    if (dd->sizeZ <= expected) {
      return pDVar3;
    }
    return dd->univ[expected];
  }
  puVar5 = (uint *)((ulong)B & 0xfffffffffffffffe);
  pDVar3 = cuddCacheLookup1Zdd(dd,Cudd_zddPortFromBdd,B);
  if (pDVar3 == (DdNode *)0x0) {
    pDVar3 = *(DdNode **)(puVar5 + 4);
    if (((ulong)B & 1) == 0) {
      pDVar4 = *(DdNode **)(puVar5 + 6);
    }
    else {
      pDVar3 = (DdNode *)((ulong)pDVar3 ^ 1);
      pDVar4 = (DdNode *)(*(ulong *)(puVar5 + 6) ^ 1);
    }
    id = *puVar5;
    iVar2 = 0x7fffffff;
    if ((long)(int)id != 0x7fffffff) {
      iVar2 = dd->perm[(int)id];
    }
    pDVar3 = zddPortFromBddStep(dd,pDVar3,iVar2 + 1);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar4 = zddPortFromBddStep(dd,pDVar4,iVar2 + 1);
      if (pDVar4 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        data = cuddZddGetNode(dd,id,pDVar3,pDVar4);
        if (data != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)data & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDerefZdd(dd,pDVar3);
          Cudd_RecursiveDerefZdd(dd,pDVar4);
          cuddCacheInsert1(dd,Cudd_zddPortFromBdd,B,data);
          pDVar3 = data;
          for (lVar6 = (long)iVar2; expected < lVar6; lVar6 = lVar6 + -1) {
            pDVar4 = cuddZddGetNode(dd,dd->invperm[lVar6 + -1],pDVar3,pDVar3);
            if (pDVar4 == (DdNode *)0x0) goto LAB_0063aa36;
            piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDerefZdd(dd,pDVar3);
            pDVar3 = pDVar4;
          }
          goto LAB_0063aa09;
        }
        Cudd_RecursiveDerefZdd(dd,pDVar3);
        pDVar3 = pDVar4;
      }
LAB_0063aa36:
      Cudd_RecursiveDerefZdd(dd,pDVar3);
    }
    pDVar3 = (DdNode *)0x0;
  }
  else {
    iVar2 = 0x7fffffff;
    if ((ulong)*puVar5 != 0x7fffffff) {
      iVar2 = dd->perm[*puVar5];
    }
    if (iVar2 <= expected) {
      return pDVar3;
    }
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    for (lVar6 = (long)iVar2; expected < lVar6; lVar6 = lVar6 + -1) {
      pDVar4 = cuddZddGetNode(dd,dd->invperm[lVar6 + -1],pDVar3,pDVar3);
      if (pDVar4 == (DdNode *)0x0) goto LAB_0063aa36;
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDerefZdd(dd,pDVar3);
      pDVar3 = pDVar4;
    }
LAB_0063aa09:
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
  }
  return pDVar3;
}

Assistant:

static DdNode *
zddPortFromBddStep(
  DdManager * dd,
  DdNode * B,
  int  expected)
{
    DdNode      *res, *prevZdd, *t, *e;
    DdNode      *Breg, *Bt, *Be;
    int         id, level;

    statLine(dd);
    /* Terminal cases. */
    if (B == Cudd_Not(DD_ONE(dd)))
        return(DD_ZERO(dd));
    if (B == DD_ONE(dd)) {
        if (expected >= dd->sizeZ) {
            return(DD_ONE(dd));
        } else {
            return(dd->univ[expected]);
        }
    }

    Breg = Cudd_Regular(B);

    /* Computed table look-up. */
    res = cuddCacheLookup1Zdd(dd,Cudd_zddPortFromBdd,B);
    if (res != NULL) {
        level = cuddI(dd,Breg->index);
        /* Adding DC vars. */
        if (expected < level) {
            /* Add suppressed variables. */
            cuddRef(res);
            for (level--; level >= expected; level--) {
                prevZdd = res;
                id = dd->invperm[level];
                res = cuddZddGetNode(dd, id, prevZdd, prevZdd);
                if (res == NULL) {
                    Cudd_RecursiveDerefZdd(dd, prevZdd);
                    return(NULL);
                }
                cuddRef(res);
                Cudd_RecursiveDerefZdd(dd, prevZdd);
            }
            cuddDeref(res);
        }
        return(res);
    }   /* end of cache look-up */

    if (Cudd_IsComplement(B)) {
        Bt = Cudd_Not(cuddT(Breg));
        Be = Cudd_Not(cuddE(Breg));
    } else {
        Bt = cuddT(Breg);
        Be = cuddE(Breg);
    }

    id = Breg->index;
    level = cuddI(dd,id);
    t = zddPortFromBddStep(dd, Bt, level+1);
    if (t == NULL) return(NULL);
    cuddRef(t);
    e = zddPortFromBddStep(dd, Be, level+1);
    if (e == NULL) {
        Cudd_RecursiveDerefZdd(dd, t);
        return(NULL);
    }
    cuddRef(e);
    res = cuddZddGetNode(dd, id, t, e);
    if (res == NULL) {
        Cudd_RecursiveDerefZdd(dd, t);
        Cudd_RecursiveDerefZdd(dd, e);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDerefZdd(dd, t);
    Cudd_RecursiveDerefZdd(dd, e);

    cuddCacheInsert1(dd,Cudd_zddPortFromBdd,B,res);

    for (level--; level >= expected; level--) {
        prevZdd = res;
        id = dd->invperm[level];
        res = cuddZddGetNode(dd, id, prevZdd, prevZdd);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(dd, prevZdd);
            return(NULL);
        }
        cuddRef(res);
        Cudd_RecursiveDerefZdd(dd, prevZdd);
    }

    cuddDeref(res);
    return(res);

}